

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O1

QByteArray *
QRestReplyPrivate::contentCharset(QByteArray *__return_storage_ptr__,QNetworkReply *reply)

{
  QByteArrayView data;
  QByteArrayView data_00;
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  char __c;
  storage_type *psVar6;
  undefined1 *puVar7;
  storage_type *psVar8;
  undefined1 *puVar9;
  undefined1 *__n2;
  long in_FS_OFFSET;
  QByteArrayView QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QByteArrayView data_01;
  R_conflict4 r;
  char *local_168;
  char *local_160;
  undefined1 *local_158;
  char *local_150;
  undefined1 *local_148;
  QByteArray local_138;
  R_conflict7 local_118;
  R_conflict7 local_f8;
  QByteArrayView local_d8;
  R_conflict7 local_c8;
  R_conflict7 local_a8;
  QByteArrayView local_88;
  undefined1 *local_78;
  storage_type *psStack_70;
  undefined1 *local_68;
  storage_type *psStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QNetworkReply::headers((QNetworkReply *)&local_78);
  QVar10 = QHttpHeaders::value((QHttpHeaders *)&local_78,ContentType,(QByteArrayView)ZEXT816(0));
  QByteArray::QByteArray(&local_138,QVar10.m_data,QVar10.m_size);
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_78);
  local_58.field_2._M_allocated_capacity = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._M_dataplus._M_p = &DAT_aaaaaaaaaaaaaaaa;
  local_58._M_string_length = (size_type)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  psStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8.m_size = local_138.d.size;
  local_d8.m_data = local_138.d.ptr;
  eat_CWS(&local_d8);
  local_f8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_f8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_f8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
  QVar10.m_data = local_d8.m_data;
  QVar10.m_size = local_d8.m_size;
  parse_token(&local_f8,QVar10);
  qVar3 = local_f8.token.m_size;
  if ((undefined1 *)local_f8.token.m_size != (undefined1 *)0x0) {
    local_d8.m_size = local_f8.tail.m_size;
    local_d8.m_data = local_f8.tail.m_data;
    eat_CWS(&local_d8);
    if (((undefined1 *)local_d8.m_size != (undefined1 *)0x0) && (*local_d8.m_data == '/')) {
      local_d8.m_data = local_d8.m_data + 1;
      local_d8.m_size = local_d8.m_size + -1;
      eat_CWS(&local_d8);
      local_118.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
      local_118.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
      data.m_data = local_d8.m_data;
      data.m_size = local_d8.m_size;
      parse_token(&local_118,data);
      qVar2 = local_118.token.m_size;
      if ((undefined1 *)local_118.token.m_size == (undefined1 *)0x0) {
        local_68 = (undefined1 *)0x0;
        psStack_60 = (storage_type *)0x0;
        local_78 = (undefined1 *)0x0;
        psStack_70 = (storage_type *)0x0;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity =
             local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      }
      else {
        local_d8.m_size = local_118.tail.m_size;
        local_d8.m_data = local_118.tail.m_data;
        eat_CWS(&local_d8);
        local_58.field_2._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78 = (undefined1 *)qVar3;
        psStack_70 = local_f8.token.m_data;
        local_68 = (undefined1 *)qVar2;
        psStack_60 = local_118.token.m_data;
        local_58._M_string_length = 0;
        local_58.field_2._M_allocated_capacity = 0xaaaaaaaaaaaaaa00;
        bVar4 = false;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        do {
          if (((undefined1 *)local_d8.m_size == (undefined1 *)0x0) || (*local_d8.m_data != ';'))
          goto LAB_00224aec;
          local_d8.m_data = local_d8.m_data + 1;
          local_d8.m_size = local_d8.m_size + -1;
          eat_CWS(&local_d8);
          psVar8 = local_d8.m_data;
          qVar3 = local_d8.m_size;
          data_00.m_data = local_d8.m_data;
          data_00.m_size = local_d8.m_size;
          local_88.m_size = local_d8.m_size;
          local_88.m_data = local_d8.m_data;
          local_a8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
          local_a8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_a8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
          parse_token(&local_a8,data_00);
          puVar9 = (undefined1 *)local_a8.token.m_size;
          if ((undefined1 *)local_a8.token.m_size == (undefined1 *)0x0) {
LAB_002249fc:
            local_168 = (char *)0x0;
            puVar9 = (undefined1 *)0x0;
            psVar6 = (char *)0x0;
            __n2 = (undefined1 *)0x0;
            local_158 = (undefined1 *)qVar3;
          }
          else {
            local_88.m_size = local_a8.tail.m_size;
            local_88.m_data = local_a8.tail.m_data;
            eat_CWS(&local_88);
            if (((undefined1 *)local_88.m_size == (undefined1 *)0x0) || (*local_88.m_data != '='))
            goto LAB_002249fc;
            local_88.m_data = local_88.m_data + 1;
            local_88.m_size = local_88.m_size + -1;
            eat_CWS(&local_88);
            psVar6 = local_88.m_data;
            qVar2 = local_88.m_size;
            if (((undefined1 *)local_88.m_size == (undefined1 *)0x0) || (*local_88.m_data != '\"'))
            {
              local_c8.tail.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.tail.m_data = &DAT_aaaaaaaaaaaaaaaa;
              local_c8.token.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
              local_c8.token.m_data = &DAT_aaaaaaaaaaaaaaaa;
              data_01.m_data = local_88.m_data;
              data_01.m_size = local_88.m_size;
              parse_token(&local_c8,data_01);
              if ((undefined1 *)local_c8.token.m_size == (undefined1 *)0x0) {
                __n2 = (undefined1 *)0x0;
                local_168 = (char *)0x0;
                psVar6 = (char *)0x0;
                puVar9 = (undefined1 *)0x0;
                local_158 = (undefined1 *)qVar3;
              }
              else {
                local_88.m_size = local_c8.tail.m_size;
                local_88.m_data = local_c8.tail.m_data;
                psVar6 = local_a8.token.m_data;
                psVar8 = local_c8.tail.m_data;
                __n2 = (undefined1 *)local_c8.token.m_size;
                local_158 = (undefined1 *)local_c8.tail.m_size;
                local_168 = local_c8.token.m_data;
              }
            }
            else {
              local_160 = local_88.m_data;
              if (1 < local_88.m_size) {
                __n2 = &DAT_aaaaaaaaaaaaaaaa;
                local_150 = &DAT_aaaaaaaaaaaaaaaa;
                local_158 = &DAT_aaaaaaaaaaaaaaaa;
                local_168 = &DAT_aaaaaaaaaaaaaaaa;
                puVar7 = (undefined1 *)0x1;
                do {
                  local_148 = puVar7 + 1;
                  __c = psVar6[(long)puVar7];
                  if (__c == '\\') {
                    bVar1 = false;
                    if ((undefined1 *)qVar2 != local_148) {
                      __c = psVar6[(long)(puVar7 + 1)];
                      local_148 = puVar7 + 2;
                      goto LAB_0022498e;
                    }
                  }
                  else if (__c == '\"') {
                    local_150 = psVar6 + (long)local_148;
                    local_158 = (undefined1 *)(qVar2 + -(long)local_148);
                    bVar1 = true;
                    __n2 = local_148;
                    local_168 = psVar6;
                  }
                  else {
LAB_0022498e:
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::_M_replace_aux(&local_58,local_58._M_string_length,0,1,__c);
                    bVar1 = false;
                  }
                  if (bVar1) {
                    local_160 = local_150;
                    goto LAB_002249d8;
                  }
                  puVar7 = local_148;
                } while ((long)local_148 < qVar2);
              }
              local_168 = (char *)0x0;
              __n2 = (undefined1 *)0x0;
              local_158 = (undefined1 *)qVar2;
LAB_002249d8:
              if (__n2 == (undefined1 *)0x0) goto LAB_002249fc;
              local_88.m_data = local_160;
              psVar6 = local_a8.token.m_data;
              psVar8 = local_160;
              local_88.m_size = (qsizetype)local_158;
            }
          }
          QVar11.m_data = psVar6;
          QVar11.m_size = (qsizetype)puVar9;
          QVar12.m_data = "charset";
          QVar12.m_size = 7;
          iVar5 = QtPrivate::compareStrings(QVar11,QVar12,CaseInsensitive);
          if (iVar5 == 0) {
            iVar5 = 1;
            bVar4 = true;
            if ((local_58._M_string_length == 0) &&
               ((__n2 == (undefined1 *)0x0 || (*local_168 != '\"')))) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_58,0,0,local_168,(size_type)__n2);
            }
          }
          else {
            local_58._M_string_length = 0;
            *local_58._M_dataplus._M_p = '\0';
            iVar5 = 3;
            if (local_158 != (undefined1 *)qVar3) {
              local_d8.m_size = (qsizetype)local_158;
              local_d8.m_data = psVar8;
              eat_CWS(&local_d8);
              iVar5 = 0;
            }
          }
        } while (iVar5 == 0);
        if (((iVar5 != 3) && (!bVar4)) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2)) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_00224aec;
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_68 = (undefined1 *)0x0;
  psStack_60 = (storage_type *)0x0;
  local_78 = (undefined1 *)0x0;
  psStack_70 = (storage_type *)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity =
       local_58.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00224aec:
  if ((local_78 == (undefined1 *)0x0) || (local_58._M_string_length == 0)) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = "UTF-8";
    (__return_storage_ptr__->d).size = 5;
  }
  else {
    QByteArray::QByteArray
              (__return_storage_ptr__,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QRestReplyPrivate::contentCharset(const QNetworkReply* reply)
{
    // Content-type consists of mimetype and optional parameters, of which one may be 'charset'
    // Example values and their combinations below are all valid, see RFC 7231 section 3.1.1.5
    // and RFC 2045 section 5.1
    //
    // text/plain; charset=utf-8
    // text/plain; charset=utf-8;version=1.7
    // text/plain; charset = utf-8
    // text/plain; charset ="utf-8"

    const QByteArray contentTypeValue =
            reply->headers().value(QHttpHeaders::WellKnownHeader::ContentType).toByteArray();

    const auto r = parse_content_type(contentTypeValue);
    if (r && !r.charset.empty())
        return QByteArrayView(r.charset).toByteArray();
    else
        return "UTF-8"_ba; // Default to the most commonly used UTF-8.
}